

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::XGLImporter::ReadObject(XGLImporter *this,TempScope *scope,bool skipFirst,char *closetag)

{
  _Rb_tree_header *p_Var1;
  pointer ppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  aiNode *paVar6;
  bool bVar7;
  iterator iVar8;
  uint *__s;
  aiNode **__s_00;
  ulong uVar9;
  uint i_1;
  uint i_2;
  pointer ppaVar10;
  long lVar11;
  ulong uVar12;
  uint id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  uint i;
  allocator<char> local_e9;
  aiNode *local_e8;
  _Rb_tree_color local_dc;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  _Vector_base<aiNode_*,_std::allocator<aiNode_*>_> local_b8;
  string local_98;
  char *local_78;
  undefined1 local_70 [64];
  
  local_78 = closetag;
  local_e8 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(local_e8);
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (skipFirst) goto LAB_0050c965;
  do {
    bVar7 = ReadElementUpToClosing(this,local_78);
    if (!bVar7) {
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_d8._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_d8._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<Assimp::XGLImporter::SortMeshByMaterialId>)scope);
      uVar9 = (ulong)((long)local_d8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8._M_impl.super__Vector_impl_data._M_start) >> 2;
      local_e8->mNumMeshes = (uint)uVar9;
      if ((uint)uVar9 != 0) {
        uVar12 = (long)local_d8._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc;
        __s = (uint *)operator_new__(uVar12);
        memset(__s,0,uVar12);
        local_e8->mMeshes = __s;
        for (uVar12 = 0; uVar12 < (uVar9 & 0xffffffff); uVar12 = uVar12 + 1) {
          local_e8->mMeshes[uVar12] = local_d8._M_impl.super__Vector_impl_data._M_start[uVar12];
          uVar9 = (ulong)local_e8->mNumMeshes;
        }
      }
      ppaVar10 = local_b8._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3;
      local_e8->mNumChildren = (uint)uVar9;
      if ((uint)uVar9 != 0) {
        uVar12 = (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b8._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
        __s_00 = (aiNode **)operator_new__(uVar12);
        memset(__s_00,0,uVar12);
        local_e8->mChildren = __s_00;
        for (uVar12 = 0; uVar12 < (uVar9 & 0xffffffff); uVar12 = uVar12 + 1) {
          local_e8->mChildren[uVar12] = ppaVar10[uVar12];
          local_b8._M_impl.super__Vector_impl_data._M_start[uVar12]->mParent = local_e8;
          uVar9 = (ulong)local_e8->mNumChildren;
          ppaVar10 = local_b8._M_impl.super__Vector_impl_data._M_start;
        }
      }
      paVar6 = local_e8;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
      std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base(&local_b8);
      return paVar6;
    }
LAB_0050c965:
    GetElementName_abi_cxx11_(&local_98,this);
    bVar7 = std::operator==(&local_98,"mesh");
    if (bVar7) {
      ppaVar2 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppaVar3 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar7 = ReadMesh(this,scope);
      if (bVar7) {
        ppaVar4 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        ppaVar5 = (scope->meshes_linear).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        for (lVar11 = (long)ppaVar2 - (long)ppaVar3 >> 3;
            (long)ppaVar4 - (long)ppaVar5 >> 3 != lVar11; lVar11 = lVar11 + 1) {
          local_70._0_4_ = (int)lVar11;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,
                     (uint *)local_70);
        }
      }
    }
    else {
      bVar7 = std::operator==(&local_98,"mat");
      if (bVar7) {
        ReadMaterial(this,scope);
      }
      else {
        bVar7 = std::operator==(&local_98,"object");
        if (bVar7) {
          local_70._0_8_ = ReadObject(this,scope,false,"object");
          std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                    ((vector<aiNode*,std::allocator<aiNode*>> *)&local_b8,(aiNode **)local_70);
        }
        else {
          bVar7 = std::operator==(&local_98,"objectref");
          if (!bVar7) {
            bVar7 = std::operator==(&local_98,"meshref");
            if (bVar7) {
              local_dc = ReadIndexFromText(this);
              iVar8 = std::
                      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMesh_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMesh_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
                      ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMesh_*>,_std::_Select1st<std::pair<const_unsigned_int,_aiMesh_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
                              *)scope,&local_dc);
              p_Var1 = &(scope->meshes)._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_70,"<meshref> index out of range",&local_e9);
                LogFunctions<Assimp::XGLImporter>::ThrowException((string *)local_70);
                std::__cxx11::string::~string((string *)local_70);
              }
              for (; ((_Rb_tree_header *)iVar8._M_node != p_Var1 &&
                     (iVar8._M_node[1]._M_color == local_dc));
                  iVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node)) {
                local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
                ppaVar2 = (scope->meshes_linear).
                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar12 = (ulong)((long)(scope->meshes_linear).
                                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar2) >>
                         3;
                uVar9 = 0;
                while (uVar9 < (uVar12 & 0xffffffff)) {
                  if (ppaVar2[uVar9] == (aiMesh *)iVar8._M_node[1]._M_parent) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,
                               (value_type_conflict1 *)local_70);
                    uVar9 = local_70._0_8_ & 0xffffffff;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                  local_70._0_4_ = (int)uVar9;
                }
                if ((uint)uVar12 <= (uint)uVar9) {
                  __assert_fail("i < mcount",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/XGL/XGLLoader.cpp"
                                ,0x1a4,
                                "aiNode *Assimp::XGLImporter::ReadObject(TempScope &, bool, const char *)"
                               );
                }
              }
            }
            else {
              bVar7 = std::operator==(&local_98,"transform");
              if (bVar7) {
                ReadTrafo((aiMatrix4x4 *)local_70,this);
                (local_e8->mTransformation).d1 = (float)local_70._48_4_;
                (local_e8->mTransformation).d2 = (float)local_70._52_4_;
                (local_e8->mTransformation).d3 = (float)local_70._56_4_;
                (local_e8->mTransformation).d4 = (float)local_70._60_4_;
                (local_e8->mTransformation).c1 = (float)local_70._32_4_;
                (local_e8->mTransformation).c2 = (float)local_70._36_4_;
                (local_e8->mTransformation).c3 = (float)local_70._40_4_;
                (local_e8->mTransformation).c4 = (float)local_70._44_4_;
                (local_e8->mTransformation).b1 = (float)local_70._16_4_;
                (local_e8->mTransformation).b2 = (float)local_70._20_4_;
                (local_e8->mTransformation).b3 = (float)local_70._24_4_;
                (local_e8->mTransformation).b4 = (float)local_70._28_4_;
                (local_e8->mTransformation).a1 = (float)local_70._0_4_;
                (local_e8->mTransformation).a2 = (float)local_70._4_4_;
                (local_e8->mTransformation).a3 = (float)local_70._8_4_;
                (local_e8->mTransformation).a4 = (float)local_70._12_4_;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_98);
  } while( true );
}

Assistant:

aiNode* XGLImporter::ReadObject(TempScope& scope, bool skipFirst, const char* closetag)
{
    aiNode *nd = new aiNode;
    std::vector<aiNode*> children;
    std::vector<unsigned int> meshes;

    try {
        while (skipFirst || ReadElementUpToClosing(closetag))   {
            skipFirst = false;

            const std::string& s = GetElementName();
            if (s == "mesh") {
                const size_t prev = scope.meshes_linear.size();
                if(ReadMesh(scope)) {
                    const size_t newc = scope.meshes_linear.size();
                    for(size_t i = 0; i < newc-prev; ++i) {
                        meshes.push_back(static_cast<unsigned int>(i+prev));
                    }
                }
            }
            else if (s == "mat") {
                ReadMaterial(scope);
            }
            else if (s == "object") {
                children.push_back(ReadObject(scope));
            }
            else if (s == "objectref") {
                // XXX
            }
            else if (s == "meshref") {
                const unsigned int id = static_cast<unsigned int>( ReadIndexFromText() );

                std::multimap<unsigned int, aiMesh*>::iterator it = scope.meshes.find(id), end = scope.meshes.end();
                if (it == end) {
                    ThrowException("<meshref> index out of range");
                }

                for(; it != end && (*it).first == id; ++it) {
                    // ok, this is n^2 and should get optimized one day
                    aiMesh* const m = (*it).second;

                    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.meshes_linear.size());
                    for(; i < mcount; ++i) {
                        if (scope.meshes_linear[i] == m) {
                            meshes.push_back(i);
                            break;
                        }
                    }

                    ai_assert(i < mcount);
                }
            }
            else if (s == "transform") {
                nd->mTransformation = ReadTrafo();
            }
        }

    } catch(...) {
        for(aiNode* ch : children) {
            delete ch;
        }
        throw;
    }

    // FIX: since we used std::multimap<> to keep meshes by id, mesh order now depends on the behaviour
    // of the multimap implementation with respect to the ordering of entries with same values.
    // C++11 gives the guarantee that it uses insertion order, before it is implementation-specific.
    // Sort by material id to always guarantee a deterministic result.
    std::sort(meshes.begin(), meshes.end(), SortMeshByMaterialId(scope));

    // link meshes to node
    nd->mNumMeshes = static_cast<unsigned int>(meshes.size());
    if (nd->mNumMeshes) {
        nd->mMeshes = new unsigned int[nd->mNumMeshes]();
        for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
            nd->mMeshes[i] = meshes[i];
        }
    }

    // link children to parent
    nd->mNumChildren = static_cast<unsigned int>(children.size());
    if (nd->mNumChildren) {
        nd->mChildren = new aiNode*[nd->mNumChildren]();
        for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
            nd->mChildren[i] = children[i];
            children[i]->mParent = nd;
        }
    }

    return nd;
}